

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O0

FSerializer * __thiscall
FSerializer::Array<sector_t::splane>
          (FSerializer *this,char *key,splane *obj,splane *def,int count,bool fullcompare)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  splane *local_58;
  int local_40;
  int i;
  int max;
  bool fullcompare_local;
  int count_local;
  splane *def_local;
  splane *obj_local;
  char *key_local;
  FSerializer *this_local;
  
  if (((((save_full) || (!fullcompare)) || (bVar1 = isWriting(this), !bVar1)) ||
      ((def == (splane *)0x0 || (iVar2 = memcmp(obj,def,(long)count * 0x58), iVar2 != 0)))) &&
     (bVar1 = BeginArray(this,key), bVar1)) {
    bVar1 = isReading(this);
    max = count;
    if ((bVar1) && (uVar3 = ArraySize(this), max = count, (int)uVar3 < count)) {
      max = uVar3;
    }
    for (local_40 = 0; local_40 < max; local_40 = local_40 + 1) {
      if (def == (splane *)0x0) {
        local_58 = (splane *)0x0;
      }
      else {
        local_58 = def + local_40;
      }
      ::Serialize(this,(char *)0x0,obj + local_40,local_58);
    }
    EndArray(this);
  }
  return this;
}

Assistant:

FSerializer &Array(const char *key, T *obj, T *def, int count, bool fullcompare = false)
	{
		if (!save_full && fullcompare && isWriting() && def != nullptr && !memcmp(obj, def, count * sizeof(T)))
		{
			return *this;
		}
		if (BeginArray(key))
		{
			if (isReading())
			{
				int max = ArraySize();
				if (max < count) count = max;
			}
			for (int i = 0; i < count; i++)
			{
				Serialize(*this, nullptr, obj[i], def ? &def[i] : nullptr);
			}
			EndArray();
		}
		return *this;
	}